

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O2

aiMesh * __thiscall
Assimp::MMDImporter::CreateMesh(MMDImporter *this,PmxModel *pModel,int indexStart,int indexCount)

{
  PmxBone *pPVar1;
  float fVar2;
  byte bVar3;
  uint uVar4;
  PmxVertex *pPVar5;
  aiVector3D *paVar6;
  _Head_base<0UL,_pmx::PmxVertexSkinning_*,_false> _Var7;
  PmxBone *pPVar8;
  float fVar9;
  aiBone **ppaVar10;
  PmxModel *pPVar11;
  uint j;
  aiMesh *this_00;
  ulong *puVar12;
  aiFace *paVar13;
  int *piVar14;
  aiVector3D *paVar15;
  long lVar16;
  mapped_type *pmVar17;
  aiBone *this_01;
  iterator iVar18;
  aiVertexWeight *__s;
  aiFace *paVar19;
  PmxVertex *pPVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  uint index;
  ulong uVar25;
  size_t sVar26;
  aiVector3t<float> local_a8;
  aiBone **local_98;
  int local_8c;
  size_t local_88;
  PmxModel *local_80;
  ulong local_78;
  long local_70;
  map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  bone_vertex_map;
  
  local_88 = CONCAT44(local_88._4_4_,indexStart);
  local_80 = pModel;
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  this_00->mNumVertices = indexCount;
  uVar24 = (long)indexCount / 3 & 0xffffffff;
  this_00->mNumFaces = (uint)((long)indexCount / 3);
  puVar12 = (ulong *)operator_new__(uVar24 * 0x10 + 8);
  *puVar12 = uVar24;
  paVar13 = (aiFace *)(puVar12 + 1);
  if (4 < indexCount + 2U) {
    paVar19 = paVar13;
    do {
      paVar19->mNumIndices = 0;
      paVar19->mIndices = (uint *)0x0;
      paVar19 = paVar19 + 1;
    } while (paVar19 != paVar13 + uVar24);
  }
  this_00->mFaces = paVar13;
  iVar23 = 2;
  lVar22 = 0;
  local_78 = (ulong)(uint)indexCount;
  for (uVar25 = 0; uVar25 < uVar24; uVar25 = uVar25 + 1) {
    *(undefined4 *)((long)&this_00->mFaces->mNumIndices + lVar22) = 3;
    piVar14 = (int *)operator_new__(0xc);
    *piVar14 = iVar23 + -2;
    piVar14[1] = iVar23 + -1;
    piVar14[2] = iVar23;
    *(int **)((long)&this_00->mFaces->mIndices + lVar22) = piVar14;
    uVar24 = (ulong)this_00->mNumFaces;
    lVar22 = lVar22 + 0x10;
    iVar23 = iVar23 + 3;
  }
  uVar25 = (ulong)this_00->mNumVertices;
  uVar24 = uVar25 * 0xc;
  paVar15 = (aiVector3D *)operator_new__(uVar24);
  local_98 = (aiBone **)uVar25;
  if (uVar25 != 0) {
    memset(paVar15,0,((uVar24 - 0xc) - (uVar24 - 0xc) % 0xc) + 0xc);
  }
  this_00->mVertices = paVar15;
  paVar15 = (aiVector3D *)operator_new__(uVar24);
  pPVar11 = local_80;
  if ((int)local_98 != 0) {
    memset(paVar15,0,((uVar24 - 0xc) - (uVar24 - 0xc) % 0xc) + 0xc);
  }
  this_00->mNormals = paVar15;
  paVar15 = (aiVector3D *)operator_new__(uVar24);
  if ((int)local_98 == 0) {
    sVar26 = 0xfffffffffffffffc;
  }
  else {
    sVar26 = ((uVar24 - 0xc) - (uVar24 - 0xc) % 0xc) + 0xc;
    memset(paVar15,0,sVar26);
  }
  this_00->mTextureCoords[0] = paVar15;
  this_00->mNumUVComponents[0] = 2;
  bVar3 = (pPVar11->setting).uv;
  for (uVar25 = 0; pPVar11 = local_80, bVar3 != uVar25; uVar25 = uVar25 + 1) {
    paVar15 = (aiVector3D *)operator_new__(uVar24);
    if ((int)local_98 != 0) {
      memset(paVar15,0,sVar26);
    }
    this_00->mTextureCoords[uVar25 + 1] = paVar15;
    this_00->mNumUVComponents[uVar25 + 1] = 4;
  }
  bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_header;
  bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar24 = 0;
  iVar23 = (int)local_78;
  local_78 = local_78 & 0xffffffff;
  if (iVar23 < 1) {
    local_78 = uVar24;
  }
  lVar22 = (long)(int)local_88;
  bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bone_vertex_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (uVar24 != local_78) {
    iVar23 = (pPVar11->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
             super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar24 + lVar22];
    pPVar5 = (pPVar11->vertices)._M_t.
             super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
             super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl;
    paVar6 = this_00->mVertices;
    pPVar20 = pPVar5 + iVar23;
    fVar2 = pPVar20->position[2];
    fVar9 = pPVar20->position[1];
    paVar15 = paVar6 + uVar24;
    paVar15->x = pPVar20->position[0];
    paVar15->y = fVar9;
    paVar6[uVar24].z = fVar2;
    paVar6 = this_00->mNormals;
    fVar2 = pPVar20->normal[2];
    fVar9 = pPVar20->normal[1];
    paVar15 = paVar6 + uVar24;
    paVar15->x = pPVar20->normal[0];
    paVar15->y = fVar9;
    paVar6[uVar24].z = fVar2;
    this_00->mTextureCoords[0][uVar24].x = pPVar20->uv[0];
    this_00->mTextureCoords[0][uVar24].y = pPVar20->uv[1];
    lVar21 = 0;
    for (uVar25 = 1; uVar25 <= (pPVar11->setting).uv; uVar25 = uVar25 + 1) {
      *(undefined4 *)(*(long *)((long)this_00->mTextureCoords + lVar21 + 8) + uVar24 * 0xc) =
           *(undefined4 *)((long)(pPVar20->uva + 1) + lVar21 * 2);
      *(undefined4 *)(*(long *)((long)this_00->mTextureCoords + lVar21 + 8) + 4 + uVar24 * 0xc) =
           *(undefined4 *)((long)(pPVar20->uva + 1) + 4U + lVar21 * 2);
      lVar21 = lVar21 + 8;
    }
    _Var7._M_head_impl =
         *(PmxVertexSkinning **)
          &pPVar5[iVar23].skinning._M_t.
           super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
    ;
    local_98 = (aiBone **)uVar24;
    if ((tuple<pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>)
        _Var7._M_head_impl == (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
      lVar21 = 0;
      local_70 = 0;
      local_88 = 0;
      lVar16 = 0;
    }
    else {
      local_70 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                &pmx::PmxVertexSkinningBDEF1::typeinfo,0);
      local_88 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                &pmx::PmxVertexSkinningBDEF2::typeinfo,0);
      lVar21 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                              &pmx::PmxVertexSkinningBDEF4::typeinfo,0);
      lVar16 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                              &pmx::PmxVertexSkinningSDEF::typeinfo,0);
    }
    sVar26 = local_88;
    switch(pPVar5[iVar23].skinning_type) {
    case BDEF1:
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(local_70 + 8));
      local_a8.y = 1.0;
      local_a8.x = (float)(int)local_98;
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      break;
    case BDEF2:
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(local_88 + 8));
      fVar2 = SUB84(local_98,0);
      local_a8.y = *(float *)(sVar26 + 0x10);
      local_a8.x = fVar2;
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(sVar26 + 0xc));
      local_a8._0_8_ = CONCAT44(1.0 - *(float *)(sVar26 + 0x10),fVar2);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      break;
    case BDEF4:
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar21 + 8));
      fVar2 = SUB84(local_98,0);
      local_a8.y = *(float *)(lVar21 + 0x18);
      local_a8.x = fVar2;
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar21 + 0xc));
      local_a8.y = *(float *)(lVar21 + 0x1c);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar21 + 0x10));
      local_a8.y = *(float *)(lVar21 + 0x20);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar21 + 0x14));
      local_a8._0_8_ = CONCAT44(*(undefined4 *)(lVar21 + 0x24),fVar2);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      break;
    case SDEF:
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar16 + 8));
      fVar2 = SUB84(local_98,0);
      local_a8.y = *(float *)(lVar16 + 0x10);
      local_a8.x = fVar2;
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar16 + 0xc));
      local_a8._0_8_ = CONCAT44(1.0 - *(float *)(lVar16 + 0x10),fVar2);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      break;
    case QDEF:
      if ((_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)_Var7._M_head_impl ==
          (_Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>)0x0) {
        lVar21 = 0;
      }
      else {
        lVar21 = __dynamic_cast(_Var7._M_head_impl,&pmx::PmxVertexSkinning::typeinfo,
                                &pmx::PmxVertexSkinningQDEF::typeinfo,0);
      }
      ppaVar10 = local_98;
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar21 + 8));
      fVar2 = SUB84(ppaVar10,0);
      local_a8.y = *(float *)(lVar21 + 0x18);
      local_a8.x = fVar2;
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar21 + 0xc));
      local_a8.y = *(float *)(lVar21 + 0x1c);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar21 + 0x10));
      local_a8.y = *(float *)(lVar21 + 0x20);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
      pmVar17 = std::
                map<int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                ::operator[](&bone_vertex_map,(key_type_conflict2 *)(lVar21 + 0x14));
      local_a8._0_8_ = CONCAT44(*(undefined4 *)(lVar21 + 0x24),fVar2);
      std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                (pmVar17,(aiVertexWeight *)&local_a8);
    }
    uVar24 = (long)local_98 + 1;
  }
  uVar4 = pPVar11->bone_count;
  uVar25 = (ulong)(int)uVar4;
  uVar24 = 0xffffffffffffffff;
  if (-1 < (long)uVar25) {
    uVar24 = uVar25 * 8;
  }
  local_98 = (aiBone **)operator_new__(uVar24);
  this_00->mNumBones = uVar4;
  this_00->mBones = local_98;
  for (local_8c = 0; local_8c < (int)uVar25; local_8c = local_8c + 1) {
    this_01 = (aiBone *)operator_new(0x450);
    aiBone::aiBone(this_01);
    pPVar8 = (local_80->bones)._M_t.
             super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
             super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
             super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
    pPVar1 = pPVar8 + local_8c;
    uVar24 = pPVar8[local_8c].bone_name._M_string_length;
    if (uVar24 < 0x400) {
      (this_01->mName).length = (ai_uint32)uVar24;
      memcpy((this_01->mName).data,(pPVar1->bone_name)._M_dataplus._M_p,uVar24);
      (this_01->mName).data[uVar24] = '\0';
    }
    local_a8._0_8_ = *(ulong *)pPVar1->position ^ 0x8000000080000000;
    local_a8.z = -pPVar1->position[2];
    aiMatrix4x4t<float>::Translation(&local_a8,&this_01->mOffsetMatrix);
    iVar18 = std::
             _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
             ::find(&bone_vertex_map._M_t,&local_8c);
    if ((_Rb_tree_header *)iVar18._M_node != &bone_vertex_map._M_t._M_impl.super__Rb_tree_header) {
      uVar24 = (long)iVar18._M_node[1]._M_left - (long)iVar18._M_node[1]._M_parent >> 3;
      this_01->mNumWeights = (uint)uVar24;
      local_88 = (uVar24 & 0xffffffff) * 8;
      __s = (aiVertexWeight *)operator_new__(local_88);
      if ((uVar24 & 0xffffffff) != 0) {
        memset(__s,0,local_88);
      }
      this_01->mWeights = __s;
      for (uVar25 = 0; uVar25 < (uVar24 & 0xffffffff); uVar25 = uVar25 + 1) {
        this_01->mWeights[uVar25] =
             *(aiVertexWeight *)(&(iVar18._M_node[1]._M_parent)->_M_color + uVar25 * 2);
        uVar24 = (ulong)this_01->mNumWeights;
      }
    }
    local_98[local_8c] = this_01;
    uVar25 = (ulong)(uint)local_80->bone_count;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  ::~_Rb_tree(&bone_vertex_map._M_t);
  return this_00;
}

Assistant:

aiMesh *MMDImporter::CreateMesh(const pmx::PmxModel *pModel,
                                const int indexStart, const int indexCount) {
  aiMesh *pMesh = new aiMesh;

  pMesh->mNumVertices = indexCount;

  pMesh->mNumFaces = indexCount / 3;
  pMesh->mFaces = new aiFace[pMesh->mNumFaces];

  const int numIndices = 3; // triangular face
  for (unsigned int index = 0; index < pMesh->mNumFaces; index++) {
    pMesh->mFaces[index].mNumIndices = numIndices;
    unsigned int *indices = new unsigned int[numIndices];
    indices[0] = numIndices * index;
    indices[1] = numIndices * index + 1;
    indices[2] = numIndices * index + 2;
    pMesh->mFaces[index].mIndices = indices;
  }

  pMesh->mVertices = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
  pMesh->mTextureCoords[0] = new aiVector3D[pMesh->mNumVertices];
  pMesh->mNumUVComponents[0] = 2;

  // additional UVs
  for (int i = 1; i <= pModel->setting.uv; i++) {
    pMesh->mTextureCoords[i] = new aiVector3D[pMesh->mNumVertices];
    pMesh->mNumUVComponents[i] = 4;
  }

  map<int, vector<aiVertexWeight>> bone_vertex_map;

  // fill in contents and create bones
  for (int index = 0; index < indexCount; index++) {
    const pmx::PmxVertex *v =
        &pModel->vertices[pModel->indices[indexStart + index]];
    const float *position = v->position;
    pMesh->mVertices[index].Set(position[0], position[1], position[2]);
    const float *normal = v->normal;

    pMesh->mNormals[index].Set(normal[0], normal[1], normal[2]);
    pMesh->mTextureCoords[0][index].x = v->uv[0];
    pMesh->mTextureCoords[0][index].y = v->uv[1];

    for (int i = 1; i <= pModel->setting.uv; i++) {
      // TODO: wrong here? use quaternion transform?
      pMesh->mTextureCoords[i][index].x = v->uva[i][0];
      pMesh->mTextureCoords[i][index].y = v->uva[i][1];
    }

    // handle bone map
    const auto vsBDEF1_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF1 *>(v->skinning.get());
    const auto vsBDEF2_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF2 *>(v->skinning.get());
    const auto vsBDEF4_ptr =
        dynamic_cast<pmx::PmxVertexSkinningBDEF4 *>(v->skinning.get());
    const auto vsSDEF_ptr =
        dynamic_cast<pmx::PmxVertexSkinningSDEF *>(v->skinning.get());
    switch (v->skinning_type) {
    case pmx::PmxVertexSkinningType::BDEF1:
      bone_vertex_map[vsBDEF1_ptr->bone_index].push_back(
          aiVertexWeight(index, 1.0));
      break;
    case pmx::PmxVertexSkinningType::BDEF2:
      bone_vertex_map[vsBDEF2_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF2_ptr->bone_weight));
      bone_vertex_map[vsBDEF2_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsBDEF2_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::BDEF4:
      bone_vertex_map[vsBDEF4_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight1));
      bone_vertex_map[vsBDEF4_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight2));
      bone_vertex_map[vsBDEF4_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight3));
      bone_vertex_map[vsBDEF4_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsBDEF4_ptr->bone_weight4));
      break;
    case pmx::PmxVertexSkinningType::SDEF: // TODO: how to use sdef_c, sdef_r0,
                                           // sdef_r1?
      bone_vertex_map[vsSDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsSDEF_ptr->bone_weight));
      bone_vertex_map[vsSDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, 1.0f - vsSDEF_ptr->bone_weight));
      break;
    case pmx::PmxVertexSkinningType::QDEF:
      const auto vsQDEF_ptr =
          dynamic_cast<pmx::PmxVertexSkinningQDEF *>(v->skinning.get());
      bone_vertex_map[vsQDEF_ptr->bone_index1].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight1));
      bone_vertex_map[vsQDEF_ptr->bone_index2].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight2));
      bone_vertex_map[vsQDEF_ptr->bone_index3].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight3));
      bone_vertex_map[vsQDEF_ptr->bone_index4].push_back(
          aiVertexWeight(index, vsQDEF_ptr->bone_weight4));
      break;
    }
  }

  // make all bones for each mesh
  // assign bone weights to skinned bones (otherwise just initialize)
  auto bone_ptr_ptr = new aiBone *[pModel->bone_count];
  pMesh->mNumBones = pModel->bone_count;
  pMesh->mBones = bone_ptr_ptr;
  for (auto ii = 0; ii < pModel->bone_count; ++ii) {
    auto pBone = new aiBone;
    const auto &pmxBone = pModel->bones[ii];
    pBone->mName = pmxBone.bone_name;
    aiVector3D pos(pmxBone.position[0], pmxBone.position[1], pmxBone.position[2]);
    aiMatrix4x4::Translation(-pos, pBone->mOffsetMatrix);
    auto it = bone_vertex_map.find(ii);
    if (it != bone_vertex_map.end()) {
      pBone->mNumWeights = static_cast<unsigned int>(it->second.size());
      pBone->mWeights = new aiVertexWeight[pBone->mNumWeights];
      for (unsigned int j = 0; j < pBone->mNumWeights; j++) {
          pBone->mWeights[j] = it->second[j];
      }
    }
    bone_ptr_ptr[ii] = pBone;
  }

  return pMesh;
}